

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::GetHexNumberToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  byte *pbVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  LiteralType literal_type;
  byte *pbVar7;
  
  bVar4 = ReadHexNum(this);
  if (!bVar4) goto LAB_00157233;
  pbVar7 = (byte *)this->buffer_end_;
  pbVar1 = (byte *)this->cursor_;
  if (pbVar1 < pbVar7) {
    bVar4 = *pbVar1 == 0x2e;
  }
  else {
    bVar4 = false;
  }
  if (bVar4 && pbVar1 < pbVar7) {
    this->cursor_ = (char *)(pbVar1 + 1);
  }
  if (bVar4) {
    if (this->cursor_ < pbVar7) {
      lVar5 = (ulong)(byte)*this->cursor_ + 1;
    }
    else {
      lVar5 = 0;
    }
    token_type = First_Literal;
    if (((""[lVar5] & 4U) != 0) && (bVar4 = ReadHexNum(this), !bVar4)) goto LAB_00157233;
  }
  pcVar2 = this->buffer_end_;
  pcVar3 = this->cursor_;
  if (pcVar3 < pcVar2) {
    bVar4 = *pcVar3 == 'p';
  }
  else {
    bVar4 = false;
  }
  if (bVar4 && pcVar3 < pcVar2) {
    this->cursor_ = pcVar3 + 1;
  }
  if (bVar4) {
LAB_001571bf:
    pcVar3 = this->cursor_;
    bVar4 = true;
    if (pcVar3 < pcVar2) {
      if (*pcVar3 != '+') {
        bVar4 = *pcVar3 != '-';
        goto LAB_001571d7;
      }
LAB_001571e1:
      this->cursor_ = pcVar3 + 1;
    }
    else {
LAB_001571d7:
      if (!(bool)(pcVar2 <= pcVar3 | bVar4)) goto LAB_001571e1;
    }
    bVar4 = ReadNum(this);
    token_type = First_Literal;
    if (!bVar4) goto LAB_00157233;
  }
  else {
    pcVar3 = this->cursor_;
    if (pcVar3 < pcVar2) {
      bVar4 = *pcVar3 == 'P';
    }
    else {
      bVar4 = false;
    }
    if (bVar4 && pcVar3 < pcVar2) {
      this->cursor_ = pcVar3 + 1;
    }
    if (bVar4) goto LAB_001571bf;
  }
  pbVar7 = (byte *)this->cursor_;
  iVar6 = 0;
  while( true ) {
    if (pbVar7 < this->buffer_end_) {
      lVar5 = (ulong)*pbVar7 + 1;
    }
    else {
      lVar5 = 0;
    }
    if ((""[lVar5] & 1U) == 0) break;
    if (pbVar7 < this->buffer_end_) {
      pbVar7 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar7;
    }
    iVar6 = iVar6 + -1;
  }
  if (iVar6 == 0) {
    if (token_type == First_Literal) {
      token_type = First_Literal;
      literal_type = Hexfloat;
    }
    else {
      literal_type = Int;
    }
    LiteralToken(__return_storage_ptr__,this,token_type,literal_type);
    return __return_storage_ptr__;
  }
LAB_00157233:
  GetReservedToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetHexNumberToken(TokenType token_type) {
  if (ReadHexNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsHexDigit(PeekChar()) && !ReadHexNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('p') || MatchChar('P')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Hexfloat);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}